

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vivify.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::vivify_chain_for_units(Internal *this,int lit,Clause *reason)

{
  literal_iterator piVar1;
  uint64_t *puVar2;
  Clause *in_RDX;
  int in_ESI;
  Internal *in_RDI;
  uint64_t id;
  uint uidx;
  int *reason_lit;
  literal_iterator __end1;
  literal_iterator __begin1;
  Clause *__range1;
  int in_stack_ffffffffffffffac;
  value_type_conflict5 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int *local_28;
  
  if (((in_RDI->lrat & 1U) != 0) && (in_RDI->level == 0)) {
    local_28 = Clause::begin(in_RDX);
    piVar1 = Clause::end(in_RDX);
    for (; local_28 != piVar1; local_28 = local_28 + 1) {
      if (in_ESI != *local_28) {
        val(in_RDI,*local_28);
        in_stack_ffffffffffffffc4 = vlit(in_RDI,in_stack_ffffffffffffffac);
        puVar2 = unit_clauses(in_RDI,in_stack_ffffffffffffffac);
        in_stack_ffffffffffffffb8 = (value_type_conflict5 *)*puVar2;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

inline void Internal::vivify_chain_for_units (int lit, Clause *reason) {
  if (!lrat)
    return;
  // LOG ("building chain for units");        bad line for debugging
  // equivalence if (opts.chrono && assignment_level (lit, reason)) return;
  if (level)
    return; // not decision level 0
  assert (lrat_chain.empty ());
  for (auto &reason_lit : *reason) {
    if (lit == reason_lit)
      continue;
    assert (val (reason_lit));
    const unsigned uidx = vlit (val (reason_lit) * reason_lit);
    uint64_t id = unit_clauses (uidx);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (reason->id);
}